

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTruth.c
# Opt level: O1

uint * Aig_ManCutTruthOne(Aig_Obj_t *pNode,uint *pTruth,int nWords)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  pAVar1 = pNode->pFanin0;
  pAVar2 = pNode->pFanin1;
  lVar3 = *(long *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x28);
  lVar4 = *(long *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x28);
  if ((*(uint *)&pNode->field_0x18 & 7) == 6) {
    if (0 < nWords) {
      uVar5 = 0;
      do {
        pTruth[uVar5] = *(uint *)(lVar4 + uVar5 * 4) ^ *(uint *)(lVar3 + uVar5 * 4);
        uVar5 = uVar5 + 1;
      } while ((uint)nWords != uVar5);
    }
  }
  else if ((((uint)pAVar2 | (uint)pAVar1) & 1) == 0) {
    if (0 < nWords) {
      uVar5 = 0;
      do {
        pTruth[uVar5] = *(uint *)(lVar4 + uVar5 * 4) & *(uint *)(lVar3 + uVar5 * 4);
        uVar5 = uVar5 + 1;
      } while ((uint)nWords != uVar5);
    }
  }
  else if (((ulong)pAVar2 & 1) == 0 || ((ulong)pAVar1 & 1) != 0) {
    if (((byte)pAVar1 & ((ulong)pAVar2 & 1) == 0) == 0) {
      if (0 < nWords) {
        uVar5 = 0;
        do {
          pTruth[uVar5] = ~(*(uint *)(lVar4 + uVar5 * 4) | *(uint *)(lVar3 + uVar5 * 4));
          uVar5 = uVar5 + 1;
        } while ((uint)nWords != uVar5);
      }
    }
    else if (0 < nWords) {
      uVar5 = 0;
      do {
        pTruth[uVar5] = ~*(uint *)(lVar3 + uVar5 * 4) & *(uint *)(lVar4 + uVar5 * 4);
        uVar5 = uVar5 + 1;
      } while ((uint)nWords != uVar5);
    }
  }
  else if (0 < nWords) {
    uVar5 = 0;
    do {
      pTruth[uVar5] = ~*(uint *)(lVar4 + uVar5 * 4) & *(uint *)(lVar3 + uVar5 * 4);
      uVar5 = uVar5 + 1;
    } while ((uint)nWords != uVar5);
  }
  return pTruth;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes truth table of the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
unsigned * Aig_ManCutTruthOne( Aig_Obj_t * pNode, unsigned * pTruth, int nWords )
{
    unsigned * pTruth0, * pTruth1;
    int i;
    pTruth0 = (unsigned *)Aig_ObjFanin0(pNode)->pData;
    pTruth1 = (unsigned *)Aig_ObjFanin1(pNode)->pData;
    if ( Aig_ObjIsExor(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Aig_ObjFaninC0(pNode) && !Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Aig_ObjFaninC0(pNode) && Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Aig_ObjFaninC0(pNode) && !Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Aig_ObjFaninC0(pNode) && Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    return pTruth;
}